

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_test.cc
# Opt level: O2

void __thiscall
ThreadPoolTest_Print_test_Test::~ThreadPoolTest_Print_test_Test
          (ThreadPoolTest_Print_test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ThreadPoolTest, Print_test) {
  ThreadPool pool(4);
  for (int i = 0; i < 3; ++i) {
    pool.enqueue(std::bind(func, 1));
    pool.enqueue(std::bind(func, 2));
    pool.enqueue(std::bind(func, 3));
    pool.enqueue(std::bind(func, 4));
    pool.enqueue(std::bind(func, 5));
    pool.enqueue(std::bind(func, 6));
    pool.Sync(6);
    printf("Hello master\n");
  }
  printf("final\n");
#ifndef _MSC_VER
  usleep(100);
#else
  std::this_thread::sleep_for(std::chrono::microseconds(100));
#endif
}